

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagateNoContraction.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_d5791a::TSymbolDefinitionCollectingTraverser::visitBinary
          (TSymbolDefinitionCollectingTraverser *this,TVisit param_1,TIntermBinary *node)

{
  unordered_multimap<std::__cxx11::string,glslang::TIntermOperator*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,glslang::TIntermOperator*>>>
  *this_00;
  bool bVar1;
  byte bVar2;
  int iVar3;
  TOperator TVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  mapped_type *this_01;
  undefined4 extraout_var_03;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar5;
  TIntermBinary *local_b0;
  string local_a8;
  uint local_84;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_true>
  _Stack_80;
  uint struct_dereference_index;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermBinary_*>
  local_78;
  undefined1 local_50 [8];
  ObjectAccessChain id_symbol;
  TIntermBinary *local_20;
  TIntermBinary *node_local;
  TSymbolDefinitionCollectingTraverser *pTStack_10;
  TVisit param_1_local;
  TSymbolDefinitionCollectingTraverser *this_local;
  
  local_20 = node;
  node_local._4_4_ = param_1;
  pTStack_10 = this;
  std::__cxx11::string::clear();
  iVar3 = (*(local_20->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x32])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x10))
            ((long *)CONCAT44(extraout_var,iVar3),this);
  TVar4 = glslang::TIntermOperator::getOp(&local_20->super_TIntermOperator);
  bVar1 = isAssignOperation(TVar4);
  if (bVar1) {
    bVar2 = std::__cxx11::string::empty();
    if (((bVar2 ^ 0xff) & 1) == 0) {
      __assert_fail("!current_object_.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/propagateNoContraction.cpp"
                    ,0x173,
                    "virtual bool (anonymous namespace)::TSymbolDefinitionCollectingTraverser::visitBinary(glslang::TVisit, glslang::TIntermBinary *)"
                   );
    }
    iVar3 = (*(local_20->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x32])();
    bVar1 = isPreciseObjectNode((TIntermTyped *)CONCAT44(extraout_var_00,iVar3));
    if (bVar1) {
      pVar5 = std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert(this->precise_objects_,&this->current_object_);
      id_symbol.field_2._8_8_ =
           pVar5.first.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur;
    }
    getFrontElement((ObjectAccessChain *)local_50,&this->current_object_);
    this_00 = (unordered_multimap<std::__cxx11::string,glslang::TIntermOperator*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,glslang::TIntermOperator*>>>
               *)this->symbol_definition_mapping_;
    std::make_pair<std::__cxx11::string&,glslang::TIntermBinary*&>
              (&local_78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
               &local_20);
    _Stack_80._M_cur =
         (__node_type *)
         std::
         unordered_multimap<std::__cxx11::string,glslang::TIntermOperator*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,glslang::TIntermOperator*>>>
         ::insert<std::pair<std::__cxx11::string,glslang::TIntermBinary*>>(this_00,&local_78);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermBinary_*>
    ::~pair(&local_78);
    std::__cxx11::string::clear();
    iVar3 = (*(local_20->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x33])();
    (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x10))
              ((long *)CONCAT44(extraout_var_01,iVar3),this);
    std::__cxx11::string::~string((string *)local_50);
  }
  else {
    TVar4 = glslang::TIntermOperator::getOp(&local_20->super_TIntermOperator);
    bVar1 = isDereferenceOperation(TVar4);
    if (bVar1) {
      TVar4 = glslang::TIntermOperator::getOp(&local_20->super_TIntermOperator);
      if (TVar4 == EOpIndexDirectStruct) {
        iVar3 = (*(local_20->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x33])();
        local_84 = getStructIndexFromConstantUnion((TIntermTyped *)CONCAT44(extraout_var_02,iVar3));
        std::__cxx11::string::push_back((char)this + 'P');
        std::__cxx11::to_string(&local_a8,local_84);
        std::__cxx11::string::append((string *)&this->current_object_);
        std::__cxx11::string::~string((string *)&local_a8);
      }
      local_b0 = local_20;
      this_01 = std::
                unordered_map<glslang::TIntermTyped_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<glslang::TIntermTyped_*>,_std::equal_to<glslang::TIntermTyped_*>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](this->accesschain_mapping_,(key_type *)&local_b0);
      std::__cxx11::string::operator=((string *)this_01,(string *)&this->current_object_);
    }
    else {
      std::__cxx11::string::clear();
      iVar3 = (*(local_20->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x33])();
      (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar3) + 0x10))
                ((long *)CONCAT44(extraout_var_03,iVar3),this);
    }
  }
  return false;
}

Assistant:

bool TSymbolDefinitionCollectingTraverser::visitBinary(glslang::TVisit /* visit */,
                                                       glslang::TIntermBinary* node)
{
    // Traverses the left node to build the access chain info for the object.
    current_object_.clear();
    node->getLeft()->traverse(this);

    if (isAssignOperation(node->getOp())) {
        // We should always be able to get an access chain for the left node.
        assert(!current_object_.empty());

        // If the left node object is 'precise', it is an initial precise object
        // specified in the shader source. Adds it to the initial work list to
        // process later.
        if (isPreciseObjectNode(node->getLeft())) {
            // The left node is an 'precise' object node, add its access chain to
            // the set of 'precise' objects. This is to collect the initial set
            // of 'precise' objects.
            precise_objects_.insert(current_object_);
        }
        // Gets the symbol ID from the object access chain, which should be the
        // first element recorded in the access chain.
        ObjectAccessChain id_symbol = getFrontElement(current_object_);
        // Adds a mapping from the symbol ID to this assignment operation node.
        symbol_definition_mapping_.insert(std::make_pair(id_symbol, node));

        // Traverses the right node, there may be other 'assignment'
        // operations in the right.
        current_object_.clear();
        node->getRight()->traverse(this);

    } else if (isDereferenceOperation(node->getOp())) {
        // The left node (parent node) is a struct type object. We need to
        // record the access chain information of the current node into its
        // object id.
        if (node->getOp() == glslang::EOpIndexDirectStruct) {
            unsigned struct_dereference_index = getStructIndexFromConstantUnion(node->getRight());
            current_object_.push_back(ObjectAccesschainDelimiter);
            current_object_.append(std::to_string(struct_dereference_index));
        }
        accesschain_mapping_[node] = current_object_;

        // For a dereference node, there is no need to traverse the right child
        // node as the right node should always be an integer type object.

    } else {
        // For other binary nodes, still traverse the right node.
        current_object_.clear();
        node->getRight()->traverse(this);
    }
    return false;
}